

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
::createInstance(QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
                 *this,Context *context)

{
  TestInstance *this_00;
  Context *context_local;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
  *this_local;
  
  this_00 = (TestInstance *)operator_new(0x108);
  TessellationShaderSecondrayTestInstance::TessellationShaderSecondrayTestInstance
            ((TessellationShaderSecondrayTestInstance *)this_00,context,&this->m_data,
             &this->m_parametersGraphic);
  return this_00;
}

Assistant:

vkt::TestInstance* createInstance (vkt::Context& context) const
	{
		return new Instance(context, m_data, m_parametersGraphic);
	}